

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O3

bool_t wwIsW(word *a,size_t n,word w)

{
  uint uVar1;
  long lVar2;
  
  if (n != 0) {
    uVar1 = (uint)(*a == w);
    lVar2 = n - 1;
    if (lVar2 != 0) {
      uVar1 = (uint)(*a == w);
      do {
        if (a[lVar2] != 0) {
          uVar1 = 0;
        }
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    return uVar1;
  }
  return (bool_t)(w == 0);
}

Assistant:

bool_t SAFE(wwIsW)(const word a[], size_t n, register word w)
{
	register bool_t ret;
	ASSERT(wwIsValid(a, n));
	if (n == 0)
		ret = wordEq(w, 0);
	else
	{
		ret = wordEq(a[0], w);
		while (--n)
			ret &= wordEq(a[n], 0);
	}
	w = 0;
	return ret;
}